

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *other)

{
  json_value *this_00;
  _Alloc_hider *in_RSI;
  string_t *in_RDI;
  size_type local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffffc0;
  size_type local_38;
  size_type local_30;
  size_type local_28;
  size_type local_20;
  size_type local_18;
  _Alloc_hider *local_10;
  
  in_RDI->_M_dataplus = *in_RSI;
  in_RDI->_M_string_length = 0;
  local_10 = in_RSI;
  assert_invariant(in_stack_ffffffffffffffc0);
  this_00 = (json_value *)(ulong)(byte)((char)in_RDI->_M_dataplus - 1);
  switch(this_00) {
  case (json_value *)0x0:
    json_value::json_value(this_00,(object_t *)in_RDI);
    in_RDI->_M_string_length = local_18;
    break;
  case (json_value *)0x1:
    json_value::json_value(this_00,(array_t *)in_RDI);
    in_RDI->_M_string_length = local_20;
    break;
  case (json_value *)0x2:
    json_value::json_value(this_00,in_RDI);
    in_RDI->_M_string_length = local_28;
    break;
  case (json_value *)0x3:
    json_value::json_value((json_value *)&local_30,(boolean_t)((byte)local_10[8] & 1));
    in_RDI->_M_string_length = local_30;
    break;
  case (json_value *)0x4:
    json_value::json_value((json_value *)&local_38,*(number_integer_t *)(local_10 + 8));
    in_RDI->_M_string_length = local_38;
    break;
  case (json_value *)0x5:
    json_value::json_value
              ((json_value *)&stack0xffffffffffffffc0,*(number_unsigned_t *)(local_10 + 8));
    in_RDI->_M_string_length = (size_type)in_stack_ffffffffffffffc0;
    break;
  case (json_value *)0x6:
    json_value::json_value((json_value *)&local_48,*(number_float_t *)(local_10 + 8));
    in_RDI->_M_string_length = local_48;
  }
  assert_invariant(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

basic_json(const basic_json& other)
        : m_type(other.m_type)
    {
        // check of passed value is valid
        other.assert_invariant();

        switch (m_type)
        {
            case value_t::object:
            {
                m_value = *other.m_value.object;
                break;
            }

            case value_t::array:
            {
                m_value = *other.m_value.array;
                break;
            }

            case value_t::string:
            {
                m_value = *other.m_value.string;
                break;
            }

            case value_t::boolean:
            {
                m_value = other.m_value.boolean;
                break;
            }

            case value_t::number_integer:
            {
                m_value = other.m_value.number_integer;
                break;
            }

            case value_t::number_unsigned:
            {
                m_value = other.m_value.number_unsigned;
                break;
            }

            case value_t::number_float:
            {
                m_value = other.m_value.number_float;
                break;
            }

            default:
                break;
        }

        assert_invariant();
    }